

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.cpp
# Opt level: O0

bool __thiscall
tonk::ConnectionIdMap::InsertAndAssignId(ConnectionIdMap *this,id_t *idOut,IConnection *connection)

{
  uint uVar1;
  insert_result iVar2;
  uint *in_RSI;
  long in_RDI;
  bool success;
  Locker locker;
  insert_result result_1;
  insert_result result;
  Lock *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  insert_result in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *in_stack_ffffffffffffff68;
  undefined1 local_49;
  
  Locker::Locker((Locker *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
  if (*(int *)(in_RDI + 0x150) == 0) {
    uVar1 = LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::size
                      ((LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *)
                       (in_RDI + 0x30));
    if (uVar1 < 0x1000000) {
      do {
        *(int *)(in_RDI + 0x154) = *(int *)(in_RDI + 0x154) + 1;
        if ((*(uint *)(in_RDI + 0x154) < 0x100) || (0xffffff < *(uint *)(in_RDI + 0x154))) {
          *(undefined4 *)(in_RDI + 0x154) = 0x100;
        }
        in_stack_ffffffffffffff58 =
             LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::insert
                       (in_stack_ffffffffffffff68,(uint *)CONCAT44(in_stack_ffffffffffffff64,uVar1),
                        (IConnection **)in_stack_ffffffffffffff58);
      } while (((in_stack_ffffffffffffff58.second ^ 0xffU) & 1) != 0);
      *in_RSI = *(uint *)(in_RDI + 0x154);
      local_49 = true;
    }
    else {
      local_49 = false;
    }
  }
  else {
    uVar1 = *(int *)(in_RDI + 0x150) - 1;
    *(uint *)(in_RDI + 0x150) = uVar1;
    *in_RSI = (uint)*(byte *)(in_RDI + 0x50 + (ulong)uVar1);
    iVar2 = LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::insert
                      (in_stack_ffffffffffffff68,
                       (uint *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       (IConnection **)in_stack_ffffffffffffff58);
    local_49 = (bool)(iVar2.second & 1);
    if (((ulong)iVar2 & 0x100000000) == 0) {
      *(int *)(in_RDI + 0x150) = *(int *)(in_RDI + 0x150) + 1;
    }
  }
  Locker::~Locker((Locker *)0x1ddd8b);
  return local_49;
}

Assistant:

bool ConnectionIdMap::InsertAndAssignId(
    id_t& idOut,
    IConnection* connection)
{
    Locker locker(IdLock);

    if (BestUnusedCount > 0)
    {
        idOut = BestUnusedIds[--BestUnusedCount];
        const bool success = IdMap.Insert(idOut, connection);
        if (!success) {
            ++BestUnusedCount;
        }
        //ModuleLogger.Trace("ID ADD ", idOut, " + ", connection, " - ", success);
        return success;
    }

    if (IdMap.GetCount() >= protocol::kConnectionIdCount)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return false;
    }

    // Find next unused Id
    do
    {
        ++NextId;
        if (NextId < 256 || NextId >= protocol::kConnectionIdCount) {
            NextId = 256;
        }
    } while (!IdMap.Insert(NextId, connection));

    idOut = NextId;
    return true;
}